

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_result
drwav__read_chunk_header
          (drwav_read_proc onRead,void *pUserData,drwav_container container,
          drwav_uint64 *pRunningBytesReadOut,drwav_chunk_header *pHeaderOut)

{
  size_t sVar1;
  drwav_uint8 sizeInBytes_1 [4];
  drwav_uint8 sizeInBytes [8];
  byte local_2c;
  byte local_2b;
  ushort local_2a;
  ushort local_28;
  undefined6 local_26;
  
  if ((container & ~drwav_container_rf64) == drwav_container_riff) {
    sVar1 = (*onRead)(pUserData,pHeaderOut,4);
    if (sVar1 != 4) {
      return -0x35;
    }
    sVar1 = (*onRead)(pUserData,&local_2c,4);
    if (sVar1 != 4) {
      return -10;
    }
    pHeaderOut->sizeInBytes = (ulong)((uint)local_2a << 0x10 | (uint)local_2b << 8 | (uint)local_2c)
    ;
    pHeaderOut->paddingSize = local_2c & 1;
    *pRunningBytesReadOut = *pRunningBytesReadOut + 8;
  }
  else {
    sVar1 = (*onRead)(pUserData,pHeaderOut,0x10);
    if (sVar1 != 0x10) {
      return -0x35;
    }
    sVar1 = (*onRead)(pUserData,&local_28,8);
    if (sVar1 != 8) {
      return -10;
    }
    pHeaderOut->sizeInBytes = CONCAT62(local_26,local_28) - 0x18;
    pHeaderOut->paddingSize = local_28 & 7;
    *pRunningBytesReadOut = *pRunningBytesReadOut + 0x18;
  }
  return 0;
}

Assistant:

static drwav_result drwav__read_chunk_header(drwav_read_proc onRead, void* pUserData, drwav_container container, drwav_uint64* pRunningBytesReadOut, drwav_chunk_header* pHeaderOut)
{
    if (container == drwav_container_riff || container == drwav_container_rf64) {
        drwav_uint8 sizeInBytes[4];

        if (onRead(pUserData, pHeaderOut->id.fourcc, 4) != 4) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 4) != 4) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav__bytes_to_u32(sizeInBytes);
        pHeaderOut->paddingSize = drwav__chunk_padding_size_riff(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 8;
    } else {
        drwav_uint8 sizeInBytes[8];

        if (onRead(pUserData, pHeaderOut->id.guid, 16) != 16) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 8) != 8) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav__bytes_to_u64(sizeInBytes) - 24;    /* <-- Subtract 24 because w64 includes the size of the header. */
        pHeaderOut->paddingSize = drwav__chunk_padding_size_w64(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 24;
    }

    return DRWAV_SUCCESS;
}